

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void out_more_prompt(void)

{
  bool bVar1;
  int iVar2;
  int unaff_R15D;
  os_event_info_t evt;
  
  os_printz("[More]");
  os_flush();
  bVar1 = false;
LAB_00219dae:
  if (bVar1) {
    os_printz("\r      \r");
    if (unaff_R15D != 0) {
      G_std_disp.linecnt = 0;
    }
    return;
  }
  iVar2 = os_get_event(0,0,&evt);
  if (iVar2 != 5) goto code_r0x00219dc7;
  G_os_moremode = 0;
  goto LAB_00219de4;
code_r0x00219dc7:
  bVar1 = false;
  if (iVar2 == 1) {
    if ((evt.key[0] == 10) || (evt.key[0] == 0xd)) {
      unaff_R15D = 0;
      bVar1 = true;
    }
    else if (evt.key[0] == 0x20) {
LAB_00219de4:
      unaff_R15D = 1;
      bVar1 = true;
    }
  }
  goto LAB_00219dae;
}

Assistant:

void out_more_prompt()
{
#ifdef USE_MORE
    /*
     *   USE_MORE defined - we take responsibility for pagination.  Show
     *   our default MORE prompt and wait for a keystroke.  
     */

    int done;
    int next_page;

    /* display the "MORE" prompt */
    os_printz("[More]");
    os_flush();

    /* wait for an acceptable keystroke */
    for (done = FALSE ; !done ; )
    {
        os_event_info_t evt;
        
        /* get an event */
        switch(os_get_event(0, FALSE, &evt))
        {
        case OS_EVT_KEY:
            switch(evt.key[0])
            {
            case ' ':
                /* stop waiting, show one page */
                done = TRUE;
                next_page = TRUE;
                break;
                
            case '\r':
            case '\n':
                /* stop waiting, show one line */
                done = TRUE;
                next_page = FALSE;
                break;

            default:
                /* ignore any other keystrokes */
                break;
            }
            break;

        case OS_EVT_EOF:
            /* end of file - there's nothing to wait for now */
            done = TRUE;
            next_page = TRUE;

            /* don't use more prompts any more, as the user can't respond */
            G_os_moremode = FALSE;
            break;

        default:
            /* ignore other events */
            break;
        }
    }

    /* 
     *   Remove the prompt from the screen by backing up and overwriting
     *   it with spaces.  (Note that this assumes that we're running in
     *   some kind of terminal or character mode with a fixed-pitch font;
     *   if that's not the case, the OS layer should be taking
     *   responsibility for pagination anyway, so this code shouldn't be
     *   in use in the first place.)  
     */
    os_printz("\r      \r");

    /* 
     *   if they pressed the space key, it means that we should show an
     *   entire new page, so reset the line count to zero; otherwise,
     *   we'll want to display another MORE prompt at the very next line,
     *   so leave the line count alone 
     */
    if (next_page)
        G_std_disp.linecnt = 0;

#else /* USE_MORE */

    /*
     *   USE_MORE is undefined - this means that the OS layer is taking
     *   all responsibility for pagination.  We must ask the OS layer to
     *   display the MORE prompt, because we can't make any assumptions
     *   about what the prompt looks like.  
     */

    os_more_prompt();

#endif /* USE_MORE */
}